

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O0

Point2i __thiscall CT::Tracer(CT *this,Point2i *p,int *i_prev,bool *b_isolated)

{
  long lVar1;
  size_t *psVar2;
  long lVar3;
  undefined1 *in_R8;
  Point_<int> local_c0;
  Point_<int> local_b8;
  Point_<int> local_b0;
  Point_<int> local_a8;
  Point_<int> local_a0;
  Point_<int> local_98;
  Point_<int> local_90;
  Point_<int> local_88;
  Point_<int> local_80;
  Point_<int> local_78;
  Point_<int> local_70;
  Point_<int> local_68;
  Point_<int> local_60;
  Point_<int> local_58;
  Point_<int> local_50;
  Point_<int> local_48;
  Point_<int> local_40;
  Point2i crd_next;
  int i_next;
  int i_first;
  bool *b_isolated_local;
  int *i_prev_local;
  Point2i *p_local;
  CT *this_local;
  
  crd_next.x = (*(int *)b_isolated + 2) % 8;
  crd_next.y = crd_next.x;
  cv::Point_<int>::Point_(&local_40);
  do {
    switch(crd_next.x) {
    case 0:
      cv::Point_<int>::Point_(&local_50,1,0);
      cv::operator+((cv *)&local_48,(Point_<int> *)i_prev,&local_50);
      cv::Point_<int>::operator=(&local_40,&local_48);
      break;
    case 1:
      cv::Point_<int>::Point_(&local_60,1,1);
      cv::operator+((cv *)&local_58,(Point_<int> *)i_prev,&local_60);
      cv::Point_<int>::operator=(&local_40,&local_58);
      break;
    case 2:
      cv::Point_<int>::Point_(&local_70,0,1);
      cv::operator+((cv *)&local_68,(Point_<int> *)i_prev,&local_70);
      cv::Point_<int>::operator=(&local_40,&local_68);
      break;
    case 3:
      cv::Point_<int>::Point_(&local_80,-1,1);
      cv::operator+((cv *)&local_78,(Point_<int> *)i_prev,&local_80);
      cv::Point_<int>::operator=(&local_40,&local_78);
      break;
    case 4:
      cv::Point_<int>::Point_(&local_90,-1,0);
      cv::operator+((cv *)&local_88,(Point_<int> *)i_prev,&local_90);
      cv::Point_<int>::operator=(&local_40,&local_88);
      break;
    case 5:
      cv::Point_<int>::Point_(&local_a0,-1,-1);
      cv::operator+((cv *)&local_98,(Point_<int> *)i_prev,&local_a0);
      cv::Point_<int>::operator=(&local_40,&local_98);
      break;
    case 6:
      cv::Point_<int>::Point_(&local_b0,0,-1);
      cv::operator+((cv *)&local_a8,(Point_<int> *)i_prev,&local_b0);
      cv::Point_<int>::operator=(&local_40,&local_a8);
      break;
    case 7:
      cv::Point_<int>::Point_(&local_c0,1,-1);
      cv::operator+((cv *)&local_b8,(Point_<int> *)i_prev,&local_c0);
      cv::Point_<int>::operator=(&local_40,&local_b8);
    }
    if ((((-1 < local_40.y) && (-1 < local_40.x)) && (local_40.y < *(int *)((long)p[0xc] + 8))) &&
       (local_40.x < *(int *)((long)p[0xc] + 0xc))) {
      lVar1 = *(long *)((long)p[0xc] + 0x10);
      lVar3 = (long)local_40.y;
      psVar2 = cv::MatStep::operator[]((MatStep *)((long)p[0xc] + 0x48),0);
      if (*(char *)(lVar1 + lVar3 * *psVar2 + (long)local_40.x) == (char)p[0xe].y) {
        *(int *)b_isolated = (crd_next.x + 4) % 8;
        cv::Point_<int>::Point_((Point_<int> *)this,&local_40);
        return (Point2i)this;
      }
      lVar1 = *(long *)((long)p[0xc] + 0x10);
      lVar3 = (long)local_40.y;
      psVar2 = cv::MatStep::operator[]((MatStep *)((long)p[0xc] + 0x48),0);
      *(undefined1 *)(lVar1 + lVar3 * *psVar2 + (long)local_40.x) = 0xff;
    }
    crd_next.x = (crd_next.x + 1) % 8;
  } while (crd_next.x != crd_next.y);
  *in_R8 = 1;
  cv::Point_<int>::Point_((Point_<int> *)this,(Point_<int> *)i_prev);
  return (Point2i)this;
}

Assistant:

cv::Point2i Tracer(const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img_.rows && crd_next.x < img_.cols) {
                if (img_.data[crd_next.y * img_.step[0] + crd_next.x] == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
					img_.data[crd_next.y * img_.step[0] + crd_next.x] = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }